

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_xml.hpp
# Opt level: O3

ptree * lattice::operator>>(ptree *pt,graph *lat)

{
  long *plVar1;
  undefined4 uVar2;
  pointer pbVar3;
  pointer pbVar4;
  double dVar5;
  graph *pgVar6;
  int iVar7;
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>> *pbVar8;
  pointer rows;
  long lVar9;
  int *piVar10;
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>> *pbVar11;
  char *pcVar12;
  invalid_argument *piVar13;
  undefined8 uVar14;
  pointer pcVar15;
  bool bVar16;
  char *pcVar17;
  char *pcVar18;
  Index othersize;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  coordinate_t pos;
  istringstream is;
  undefined1 local_228 [24];
  undefined1 local_210 [16];
  graph *local_200;
  char *local_1f8;
  char *local_1f0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1e8;
  ptree *local_1d8;
  long local_1d0;
  char *local_1c8;
  pointer local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a8;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_198;
  pointer pbStack_180;
  pointer local_178;
  pointer pbStack_170;
  ios_base local_140 [272];
  
  local_200 = lat;
  local_1b8._0_8_ = &aStack_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"<xmlattr>.dimension","");
  local_198.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_198.
                         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
  local_198.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
  local_1d8 = pt;
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_228,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)pt,(path_type *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &aStack_1a8) {
    operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
  }
  uVar14 = local_228._8_8_;
  if (local_228[0] == (string)0x1) {
    pbVar8 = (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)__errno_location();
    uVar2 = *(undefined4 *)pbVar8;
    *(undefined4 *)pbVar8 = 0;
    rows = (pointer)strtol((char *)uVar14,(char **)local_1b8,10);
    if (local_1b8._0_8_ == uVar14) {
LAB_00119fb7:
      std::__throw_invalid_argument("stoi");
    }
    else if (((pointer)0xfffffffeffffffff < rows + -0x80000000) && (*(int *)pbVar8 != 0x22)) {
      if (*(int *)pbVar8 == 0) {
        *(undefined4 *)pbVar8 = uVar2;
      }
      goto LAB_0011952d;
    }
    std::__throw_out_of_range("stoi");
  }
  else {
    rows = (pointer)0x0;
LAB_0011952d:
    if ((((byte)local_228[0] & 1) != 0) && ((undefined1 *)local_228._8_8_ != local_210)) {
      operator_delete((void *)local_228._8_8_,local_210._0_8_ + 1);
    }
    pgVar6 = local_200;
    local_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbStack_180 = (pointer)0x0;
    local_178 = (pointer)0x0;
    pbStack_170 = (pointer)0x0;
    local_200->dim_ = (size_t)rows;
    local_228._16_8_ =
         (local_200->sites_).
         super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    local_228._0_8_ =
         (local_200->sites_).
         super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl
         .super__Vector_impl_data._M_start;
    local_228._8_8_ =
         (local_200->sites_).
         super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl
         .super__Vector_impl_data._M_finish;
    (local_200->sites_).
    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_200->sites_).
    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_200->sites_).
    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    aStack_1a8._M_allocated_capacity = 0;
    aStack_1a8._8_8_ = 0;
    local_1b8._0_8_ = rows;
    std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::~vector
              ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)local_228)
    ;
    local_228._16_8_ =
         (pgVar6->coordinates_).
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pgVar6->coordinates_).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_198.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_228._0_8_ =
         (pgVar6->coordinates_).
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_228._8_8_ =
         (pgVar6->coordinates_).
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pgVar6->coordinates_).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_198.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pgVar6->coordinates_).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_198.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_228);
    pbVar3 = (pgVar6->bonds_).
             super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (pgVar6->bonds_).
             super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (pgVar6->bonds_).
    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
    super__Vector_impl_data._M_start = pbStack_180;
    (pgVar6->bonds_).
    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
    super__Vector_impl_data._M_finish = local_178;
    (pgVar6->bonds_).
    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pbStack_170;
    pbStack_170 = (pointer)0x0;
    pbStack_180 = (pointer)0x0;
    local_178 = (pointer)0x0;
    if ((pbVar3 != (pointer)0x0) &&
       (operator_delete(pbVar3,(long)pbVar4 - (long)pbVar3), pbStack_180 != (pointer)0x0)) {
      operator_delete(pbStack_180,(long)pbStack_170 - (long)pbStack_180);
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&local_198);
    std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::~vector
              ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)
               (local_1b8 + 8));
    local_1b8._0_8_ = &aStack_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"<xmlattr>.vertices","");
    local_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_198.
                           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
    local_198.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
    boost::property_tree::
    basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
    get_optional<std::__cxx11::string>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_228,
               (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                *)local_1d8,(path_type *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != &aStack_1a8) {
      operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
    }
    uVar14 = local_228._8_8_;
    if (local_228[0] != (string)0x1) {
      local_1d0 = 0;
LAB_0011971a:
      if ((((byte)local_228[0] & 1) != 0) && ((undefined1 *)local_228._8_8_ != local_210)) {
        operator_delete((void *)local_228._8_8_,local_210._0_8_ + 1);
      }
      pcVar12 = *(char **)((long)local_1d8->m_children + 8);
      pcVar17 = (char *)(*(long *)(pcVar12 + 0x68) + -0x60);
      if (*(long *)(pcVar12 + 0x68) == 0) {
        pcVar17 = (char *)0x0;
      }
      pcVar18 = pcVar12;
      if (pcVar17 != pcVar12) {
        do {
          local_1c8 = pcVar18;
          iVar7 = std::__cxx11::string::compare(pcVar17);
          pcVar18 = pcVar17;
          if (iVar7 == 0) {
            local_1e8.m_storage.m_data = (double *)0x0;
            local_1e8.m_storage.m_rows = 0;
            local_1f0 = pcVar17;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_1e8,(Index)rows,1);
            pcVar15 = rows;
            if ((pointer)local_1e8.m_storage.m_rows != rows) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_1e8,(Index)rows,1);
              pcVar15 = (pointer)local_1e8.m_storage.m_rows;
            }
            if (0 < (long)pcVar15) {
              memset(local_1e8.m_storage.m_data,0,(long)pcVar15 << 3);
            }
            if (local_200->dim_ != 0) {
              local_1f8 = *(char **)(*(long *)(local_1f0 + 0x40) + 8);
              pcVar17 = (char *)(*(long *)(local_1f8 + 0x68) + -0x60);
              if (*(long *)(local_1f8 + 0x68) == 0) {
                pcVar17 = (char *)0x0;
              }
              if (pcVar17 != local_1f8) {
                bVar16 = false;
                do {
                  iVar7 = std::__cxx11::string::compare(pcVar17);
                  if (iVar7 == 0) {
                    if (bVar16) {
LAB_00119eba:
                      piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
                      std::invalid_argument::invalid_argument(piVar13,"duplicated <COORDINATE> tag")
                      ;
                      __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                                  std::invalid_argument::~invalid_argument);
                    }
                    std::__cxx11::istringstream::istringstream
                              ((istringstream *)local_1b8,(string *)(pcVar17 + 0x20),_S_in);
                    local_228._0_8_ = local_228 + 0x10;
                    local_228._8_8_ = (type)0x0;
                    local_228._16_8_ = local_228._16_8_ & 0xffffffffffffff00;
                    if (rows != (pointer)0x0) {
                      lVar9 = 0;
                      do {
                        std::operator>>((istream *)local_1b8,(string *)local_228);
                        uVar14 = local_228._0_8_;
                        piVar10 = __errno_location();
                        iVar7 = *piVar10;
                        *piVar10 = 0;
                        dVar5 = strtod((char *)uVar14,(char **)&local_1c0);
                        if (local_1c0 == (pointer)uVar14) {
                          std::__throw_invalid_argument("stod");
LAB_00119eae:
                          std::__throw_out_of_range("stod");
                          goto LAB_00119eba;
                        }
                        if (*piVar10 == 0) {
                          *piVar10 = iVar7;
                        }
                        else if (*piVar10 == 0x22) goto LAB_00119eae;
                        local_1e8.m_storage.m_data[lVar9] = dVar5;
                        lVar9 = lVar9 + 1;
                      } while (rows != (pointer)lVar9);
                      if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
                        operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
                      }
                    }
                    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b8);
                    std::ios_base::~ios_base(local_140);
                    bVar16 = true;
                  }
                  plVar1 = (long *)(pcVar17 + 0x68);
                  pcVar17 = (char *)(*plVar1 + -0x60);
                  if (*plVar1 == 0) {
                    pcVar17 = (char *)0x0;
                  }
                } while (pcVar17 != local_1f8);
              }
            }
            local_1b8._0_8_ = &aStack_1a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"<xmlattr>.type","")
            ;
            local_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_198.
                                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
            local_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
            boost::property_tree::
            basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
            get_optional<std::__cxx11::string>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_228,
                       (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                        *)(local_1f0 + 0x20),(path_type *)local_1b8);
            pcVar12 = local_1c8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ != &aStack_1a8) {
              operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
            }
            uVar14 = local_228._8_8_;
            pbVar11 = (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)0x0;
            if (local_228[0] == (string)0x1) {
              piVar10 = __errno_location();
              local_1f8 = (char *)CONCAT44(local_1f8._4_4_,*piVar10);
              *piVar10 = 0;
              pbVar11 = (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                         *)strtol((char *)uVar14,(char **)local_1b8,10);
              pbVar8 = (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                        *)0x0;
              if (local_1b8._0_8_ == uVar14) goto LAB_00119fab;
              if ((pbVar11 + -0x80000000 <
                   (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                    *)0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_00119f9f;
              if (*piVar10 == 0) {
                *piVar10 = (int)local_1f8;
              }
            }
            if ((((byte)local_228[0] & 1) != 0) && ((undefined1 *)local_228._8_8_ != local_210)) {
              operator_delete((void *)local_228._8_8_,local_210._0_8_ + 1);
            }
            graph::add_site(local_200,(coordinate_t *)&local_1e8,(int)pbVar11);
            free(local_1e8.m_storage.m_data);
            pcVar18 = local_1f0;
          }
          pcVar17 = (char *)(*(long *)(pcVar18 + 0x68) + -0x60);
          if (*(long *)(pcVar18 + 0x68) == 0) {
            pcVar17 = (char *)0x0;
          }
          pcVar18 = local_1c8;
        } while (pcVar17 != pcVar12);
      }
      lVar9 = (long)(local_200->sites_).
                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_200->sites_).
                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (lVar9 == 0) {
        local_1b8._0_8_ = (type)0x0;
        local_1b8._8_8_ = (pointer)0x0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1b8,(Index)rows
                   ,1);
        if ((pointer)local_1b8._8_8_ != rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1b8,
                     (Index)rows,1);
          rows = (pointer)local_1b8._8_8_;
        }
        if (0 < (long)rows) {
          memset((void *)local_1b8._0_8_,0,(long)rows << 3);
        }
        if (local_1d0 != 0) {
          lVar9 = local_1d0;
          do {
            graph::add_site(local_200,(coordinate_t *)local_1b8,0);
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        free((void *)local_1b8._0_8_);
      }
      else if ((local_1d0 != 0) && ((lVar9 >> 3) * 0x6db6db6db6db6db7 - local_1d0 != 0)) {
        piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar13,"inconsistent number of sites");
        __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pcVar12 = *(char **)((long)local_1d8->m_children + 8);
      pcVar17 = (char *)(*(long *)(pcVar12 + 0x68) + -0x60);
      if (*(long *)(pcVar12 + 0x68) == 0) {
        pcVar17 = (char *)0x0;
      }
      local_1f0 = pcVar12;
      if (pcVar17 != pcVar12) {
        do {
          iVar7 = std::__cxx11::string::compare(pcVar17);
          if (iVar7 == 0) {
            pbVar8 = (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)(pcVar17 + 0x20);
            local_1b8._0_8_ = &aStack_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"<xmlattr>.source","");
            local_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_198.
                                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
            local_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
            boost::property_tree::
            basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
            get_optional<std::__cxx11::string>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_228,pbVar8,(path_type *)local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ != &aStack_1a8) {
              operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
            }
            uVar14 = local_228._8_8_;
            if (local_228[0] != (string)0x1) {
LAB_00119efd:
              piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar13,"source attribute not found");
              __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            piVar10 = __errno_location();
            iVar7 = *piVar10;
            *piVar10 = 0;
            pcVar12 = (char *)strtol((char *)uVar14,(char **)local_1b8,10);
            if (local_1b8._0_8_ == uVar14) {
              std::__throw_invalid_argument("stoi");
LAB_00119f3d:
              std::__throw_out_of_range("stoi");
LAB_00119f49:
              piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar13,"target attribute not found");
              __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            local_1f8 = pcVar12;
            if ((pcVar12 + -0x80000000 < (char *)0xffffffff00000000) || (*piVar10 == 0x22)) {
              std::__throw_out_of_range("stoi");
              goto LAB_00119efd;
            }
            if (*piVar10 == 0) {
              *piVar10 = iVar7;
            }
            if ((local_228[0] == (string)0x1) && ((undefined1 *)local_228._8_8_ != local_210)) {
              operator_delete((void *)local_228._8_8_,local_210._0_8_ + 1);
            }
            local_1b8._0_8_ = &aStack_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"<xmlattr>.target","");
            local_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_198.
                                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
            local_198.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
            boost::property_tree::
            basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
            get_optional<std::__cxx11::string>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_228,pbVar8,(path_type *)local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ != &aStack_1a8) {
              operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
            }
            uVar14 = local_228._8_8_;
            if (local_228[0] != (string)0x1) goto LAB_00119f49;
            iVar7 = *piVar10;
            *piVar10 = 0;
            lVar9 = strtol((char *)local_228._8_8_,(char **)local_1b8,10);
            if (local_1b8._0_8_ != uVar14) {
              if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22))
              goto LAB_00119f3d;
              if (*piVar10 == 0) {
                *piVar10 = iVar7;
              }
              if ((local_228[0] == (string)0x1) && ((undefined1 *)local_228._8_8_ != local_210)) {
                operator_delete((void *)local_228._8_8_,local_210._0_8_ + 1);
              }
              local_1b8._0_8_ = &aStack_1a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b8,"<xmlattr>.type","");
              local_198.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT71(local_198.
                                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,'.');
              local_198.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._0_8_;
              boost::property_tree::
              basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              ::get_optional<std::__cxx11::string>
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_228,pbVar8,(path_type *)local_1b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._0_8_ != &aStack_1a8) {
                operator_delete((void *)local_1b8._0_8_,aStack_1a8._M_allocated_capacity + 1);
              }
              uVar14 = local_228._8_8_;
              pbVar8 = (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                        *)0x0;
              if (local_228[0] == (string)0x1) {
                iVar7 = *piVar10;
                *piVar10 = 0;
                pbVar8 = (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                          *)strtol((char *)local_228._8_8_,(char **)local_1b8,10);
                pbVar11 = (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                           *)0x0;
                if (local_1b8._0_8_ == uVar14) goto LAB_00119f93;
                if ((pbVar8 + -0x80000000 <
                     (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_00119f87;
                if (*piVar10 == 0) {
                  *piVar10 = iVar7;
                }
              }
              if ((((byte)local_228[0] & 1) != 0) && ((undefined1 *)local_228._8_8_ != local_210)) {
                operator_delete((void *)local_228._8_8_,local_210._0_8_ + 1);
              }
              graph::add_bond(local_200,(size_t)(local_1f8 + -1),lVar9 - 1,(int)pbVar8);
              pcVar12 = local_1f0;
              goto LAB_00119e73;
            }
            std::__throw_invalid_argument("stoi");
LAB_00119f87:
            std::__throw_out_of_range("stoi");
            pbVar11 = pbVar8;
LAB_00119f93:
            std::__throw_invalid_argument("stoi");
LAB_00119f9f:
            std::__throw_out_of_range("stoi");
            pbVar8 = pbVar11;
LAB_00119fab:
            std::__throw_invalid_argument("stoi");
            goto LAB_00119fb7;
          }
LAB_00119e73:
          plVar1 = (long *)(pcVar17 + 0x68);
          pcVar17 = (char *)(*plVar1 + -0x60);
          if (*plVar1 == 0) {
            pcVar17 = (char *)0x0;
          }
        } while (pcVar17 != pcVar12);
      }
      return local_1d8;
    }
    pbVar8 = (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)__errno_location();
    uVar2 = *(undefined4 *)pbVar8;
    *(undefined4 *)pbVar8 = 0;
    lVar9 = strtol((char *)uVar14,(char **)local_1b8,10);
    if (local_1b8._0_8_ != uVar14) {
      local_1d0 = lVar9;
      if ((0xfffffffeffffffff < lVar9 - 0x80000000U) && (*(int *)pbVar8 != 0x22)) {
        if (*(int *)pbVar8 == 0) {
          *(undefined4 *)pbVar8 = uVar2;
        }
        goto LAB_0011971a;
      }
      goto LAB_00119fdb;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00119fdb:
  uVar14 = std::__throw_out_of_range("stoi");
  __cxa_free_exception(pbVar8);
  _Unwind_Resume(uVar14);
}

Assistant:

inline ptree& operator>>(ptree& pt, graph& lat) {
  std::size_t dim = 0;
  if (auto str = pt.get_optional<std::string>("<xmlattr>.dimension")) {
    dim = stoi(str.get());
  }
  lat = graph(dim);

  std::size_t ns = 0;
  if (auto str = pt.get_optional<std::string>("<xmlattr>.vertices")) ns = stoi(str.get());

  for (auto& v : pt) {
    if (v.first == "VERTEX") {
      bool found_pos = false;
      coordinate_t pos = coordinate_t::Zero(dim);
      int tp = 0;
      if (lat.dimension() > 0) {
        for (auto& c : v.second) {
          if (c.first == "COORDINATE") {
            if (found_pos) throw std::invalid_argument("duplicated <COORDINATE> tag");
            std::istringstream is(c.second.data());
            std::string sin;
            for (std::size_t m = 0; m < dim; ++m) {
              is >> sin;
              pos(m) = stod(sin);
            }
            found_pos = true;
          }
        }
      }
      if (auto str = v.second.get_optional<std::string>("<xmlattr>.type")) tp = stoi(str.get());
      lat.add_site(pos, tp);
    }
  }
     
  if (lat.num_sites() > 0) {
    if (ns > 0 && lat.num_sites() != ns)
      throw std::invalid_argument("inconsistent number of sites");
  } else {
    coordinate_t pos = coordinate_t::Zero(dim);
    for (std::size_t i = 0; i < ns; ++i) lat.add_site(pos, 0);
  }
  
  for (auto& e : pt) {
    if (e.first == "EDGE") {
      std::size_t source, target; // offset one
      int tp = 0;
      if (auto str = e.second.get_optional<std::string>("<xmlattr>.source")) {
        source = stoi(str.get());
      } else {
        throw std::invalid_argument("source attribute not found");
      }
      if (auto str = e.second.get_optional<std::string>("<xmlattr>.target")) {
        target = stoi(str.get());
      } else {
        throw std::invalid_argument("target attribute not found");
      }
      if (auto str = e.second.get_optional<std::string>("<xmlattr>.type")) tp = stoi(str.get());
      lat.add_bond(source - 1, target - 1, tp);
    }
  }
  return pt;
}